

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw.c
# Opt level: O1

void raw_check_close(Raw *raw)

{
  Socket *pSVar1;
  
  if (((raw->sent_console_eof == true) && (raw->sent_socket_eof == true)) &&
     (pSVar1 = raw->s, pSVar1 != (Socket *)0x0)) {
    (*pSVar1->vt->close)(pSVar1);
    raw->s = (Socket *)0x0;
    (*raw->seat->vt->notify_remote_exit)(raw->seat);
    (*raw->seat->vt->notify_remote_disconnect)(raw->seat);
    return;
  }
  return;
}

Assistant:

static void raw_check_close(Raw *raw)
{
    /*
     * Called after we send EOF on either the socket or the console.
     * Its job is to wind up the session once we have sent EOF on both.
     */
    if (raw->sent_console_eof && raw->sent_socket_eof) {
        if (raw->s) {
            sk_close(raw->s);
            raw->s = NULL;
            seat_notify_remote_exit(raw->seat);
            seat_notify_remote_disconnect(raw->seat);
        }
    }
}